

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

ACT_TYPE despot::POMCP::UpperBoundAction(VNode *vnode,double explore_constant)

{
  int iVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  pointer ppQVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pvVar2 = VNode::children(vnode);
  ppQVar3 = (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppQVar3) {
    iVar1 = -1;
  }
  else {
    uVar4 = 0xffffffff;
    uVar5 = 0;
    dVar6 = -INFINITY;
    do {
      iVar1 = QNode::count(ppQVar3[uVar5]);
      if (iVar1 == 0) {
        return (ACT_TYPE)uVar5;
      }
      dVar7 = QNode::value((pvVar2->
                           super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
      iVar1 = VNode::count(vnode);
      dVar8 = log((double)(iVar1 + 1));
      iVar1 = QNode::count((pvVar2->
                           super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
      dVar8 = dVar8 / (double)iVar1;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar7 = dVar8 * explore_constant + dVar7;
      if (dVar6 < dVar7) {
        uVar4 = uVar5 & 0xffffffff;
      }
      iVar1 = (int)uVar4;
      if (dVar7 <= dVar6) {
        dVar7 = dVar6;
      }
      uVar5 = uVar5 + 1;
      ppQVar3 = (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      dVar6 = dVar7;
    } while (uVar5 < (ulong)((long)(pvVar2->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar3 >> 3)
            );
  }
  if (iVar1 != -1) {
    return iVar1;
  }
  __assert_fail("best_action != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/pomcp.cpp"
                ,0xc3,"static ACT_TYPE despot::POMCP::UpperBoundAction(const VNode *, double)");
}

Assistant:

ACT_TYPE POMCP::UpperBoundAction(const VNode* vnode, double explore_constant) {
	const vector<QNode*>& qnodes = vnode->children();
	double best_ub = Globals::NEG_INFTY;
	ACT_TYPE best_action = -1;

	/*
	 int total = 0;
	 for (ACT_TYPE action = 0; action < qnodes.size(); action ++) {
	 total += qnodes[action]->count();
	 double ub = qnodes[action]->value() + explore_constant * sqrt(log(vnode->count() + 1) / qnodes[action]->count());
	 cout << action << " " << ub << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
	 }
	 */

	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		if (qnodes[action]->count() == 0)
			return action;

		double ub = qnodes[action]->value()
			+ explore_constant
				* sqrt(log(vnode->count() + 1) / qnodes[action]->count());

		if (ub > best_ub) {
			best_ub = ub;
			best_action = action;
		}
	}

	assert(best_action != -1);
	return best_action;
}